

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

void __thiscall
CTcTokenizer::xlat_escape(CTcTokenizer *this,utf8_ptr *dst,utf8_ptr *p,wchar_t qu,int triple)

{
  byte bVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  size_t sVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  char *p_00;
  
  bVar1 = *p->p_;
  pbVar7 = (byte *)(p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1);
  p->p_ = (char *)pbVar7;
  wVar2 = utf8_ptr::s_getch((char *)pbVar7);
  if (wVar2 < L'^') {
    switch(wVar2) {
    case L' ':
      wVar2 = L'\x15';
      break;
    case L'!':
    case L'#':
    case L'$':
    case L'%':
    case L'&':
    case L'(':
    case L')':
    case L'*':
    case L'+':
    case L',':
    case L'-':
    case L'.':
    case L'/':
    case L'8':
    case L'9':
    case L':':
    case L';':
    case L'=':
      goto switchD_0021fcc5_caseD_21;
    case L'\"':
    case L'\'':
      if ((triple != 0) && (wVar2 == qu)) {
        pbVar7 = (byte *)p->p_;
        while (wVar3 = utf8_ptr::s_getch((char *)pbVar7), wVar3 == qu) {
          sVar4 = utf8_ptr::s_putch(dst->p_,wVar2);
          dst->p_ = dst->p_ + sVar4;
          bVar1 = *p->p_;
          pbVar7 = (byte *)(p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) +
                                    1);
          p->p_ = (char *)pbVar7;
        }
        return;
      }
      break;
    case L'0':
    case L'1':
    case L'2':
    case L'3':
    case L'4':
    case L'5':
    case L'6':
    case L'7':
      wVar2 = L'\0';
      iVar6 = 3;
      do {
        wVar3 = utf8_ptr::s_getch(p->p_);
        if ((wVar3 & 0xfffffff8U) != 0x30) break;
        iVar5 = wVar3 + wVar2 * 8;
        wVar3 = iVar5 + L'\xffffffd0';
        if (wVar3 < L'Ā') {
          wVar2 = wVar3;
        }
        if (SBORROW4(wVar3,0x100) == iVar5 + -0x130 < 0) break;
        bVar1 = *p->p_;
        p->p_ = p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      p_00 = dst->p_;
      goto LAB_0021ff4f;
    case L'<':
    case L'>':
      break;
    default:
      if (wVar2 == L'\\') break;
      goto switchD_0021fcc5_caseD_21;
    }
  }
  else {
    switch(wVar2) {
    case L'n':
      wVar2 = L'\n';
      break;
    case L'r':
      wVar2 = L'\r';
      break;
    case L't':
      wVar2 = L'\t';
      break;
    case L'u':
      bVar1 = *p->p_;
      wVar2 = L'\0';
      p->p_ = p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
      iVar6 = 4;
      do {
        wVar3 = utf8_ptr::s_getch(p->p_);
        if ((0x7f < (uint)wVar3) ||
           (((uint)(wVar3 + L'\xffffffc6') < 0xfffffff6 &&
            ((0x25 < (uint)(wVar3 + L'\xffffffbf') ||
             ((0x3f0000003fU >> ((ulong)(uint)(wVar3 + L'\xffffffbf') & 0x3f) & 1) == 0)))))) break;
        iVar5 = -0x30;
        if (L'@' < wVar3) {
          iVar5 = -0x37;
        }
        if (L'`' < wVar3) {
          iVar5 = -0x57;
        }
        wVar2 = wVar2 * 0x10 + wVar3 + iVar5;
        bVar1 = *p->p_;
        p->p_ = p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      goto LAB_0021ff4a;
    case L'v':
      wVar2 = L'\x0e';
      break;
    case L'x':
      bVar1 = *p->p_;
      wVar2 = L'\0';
      p->p_ = p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
      iVar6 = 1;
      do {
        wVar3 = utf8_ptr::s_getch(p->p_);
        if ((0x7f < (uint)wVar3) ||
           (((uint)(wVar3 + L'\xffffffc6') < 0xfffffff6 &&
            ((0x25 < (uint)(wVar3 + L'\xffffffbf') ||
             ((0x3f0000003fU >> ((ulong)(uint)(wVar3 + L'\xffffffbf') & 0x3f) & 1) == 0)))))) break;
        iVar5 = -0x30;
        if (L'@' < wVar3) {
          iVar5 = -0x37;
        }
        if (L'`' < wVar3) {
          iVar5 = -0x57;
        }
        wVar2 = wVar2 * 0x10 + wVar3 + iVar5;
        bVar1 = *p->p_;
        p->p_ = p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
        iVar6 = iVar6 + -1;
      } while (iVar6 == 0);
LAB_0021ff4a:
      p_00 = dst->p_;
LAB_0021ff4f:
      sVar4 = utf8_ptr::s_putch(p_00,wVar2);
      dst->p_ = dst->p_ + sVar4;
      return;
    default:
      if (wVar2 == L'^') {
        wVar2 = L'\x0f';
        break;
      }
      if (wVar2 == L'b') {
        wVar2 = L'\v';
        break;
      }
    case L'o':
    case L'p':
    case L'q':
    case L's':
    case L'w':
switchD_0021fcc5_caseD_21:
      log_pedantic(0x2752,(ulong)(uint)wVar2);
      *dst->p_ = '\\';
      dst->p_ = dst->p_ + 1;
    }
  }
  sVar4 = utf8_ptr::s_putch(dst->p_,wVar2);
  dst->p_ = dst->p_ + sVar4;
  bVar1 = *p->p_;
  p->p_ = p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
  return;
}

Assistant:

void CTcTokenizer::xlat_escape(utf8_ptr *dst, utf8_ptr *p,
                               wchar_t qu, int triple)
{
    int i, acc;
    
    /* get the character after the escape */
    p->inc();
    wchar_t cur = p->getch();

    /* see what we have */
    switch(cur)
    {
    case '^':
        /* caps - 0x000F */
        cur = 0x000F;
        break;
        
    case '"':
    case '\'':
        /* 
         *   If we're in triple-quote mode, and this is the matching quote, a
         *   single backslash escapes a whole run of consecutive quotes, so
         *   skip the whole run.  
         */
        if (triple && cur == qu)
        {
            /* copy and skip all consecutive quotes */
            for ( ; p->getch() == qu ; dst->setch(cur), p->inc()) ;
            
            /* we're done */
            return;
        }
        break;
        
    case 'v':
        /* miniscules - 0x000E */
        cur = 0x000E;
        break;
        
    case 'b':
        /* blank line - 0x000B */
        cur = 0x000B;
        break;
        
    case ' ':
        /* quoted space - 0x0015 */
        cur = 0x0015;
        break;

    case 'n':
        /* newline - explicitly use Unicode 10 character */
        cur = 10;
        break;

    case 'r':
        /* return - explicitly use Unicode 13 character */
        cur = 13;
        break;

    case 't':
        /* tab - explicitly use Unicode 9 character */
        cur = 9;
        break;

    case 'u':
        /* 
         *   Hex unicode character number.  Read up to 4 hex digits that
         *   follow the 'u', and use that as a Unicode character ID.  
         */
        for (i = 0, acc = 0, p->inc() ; i < 4 ; ++i, p->inc())
        {
            /* get the next character */
            cur = p->getch();
            
            /* 
             *   if it's another hex digit, add it into the accumulator;
             *   otherwise, we're done 
             */
            if (is_xdigit(cur))
                acc = 16*acc + value_of_xdigit(cur);
            else
                break;
        }
        
        /* use the accumulated value as the character number */
        dst->setch((wchar_t)acc);
        
        /* we've already skipped ahead to the next character, so we're done */
        return;
        
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
        /* 
         *   Octal ASCII character number.  Accumulate up to three octal
         *   numbers, and use the result as a character ID. 
         */
        for (i = 0, acc = 0 ; i < 3 ; ++i, p->inc())
        {
            /* get the next character */
            cur = p->getch();
            
            /* 
             *   if it's another digit, and it would leave our result in the
             *   0-255 range, count it; if not, we're done 
             */
            if (is_odigit(cur))
            {
                /* compute the new value */
                long new_acc = 8*acc + value_of_odigit(cur);
                
                /* if this would be too high, don't count it */
                if (new_acc > 255)
                    break;
                else
                    acc = new_acc;
            }
            else
                break;
        }
        
        /* use the accumulated value as the character number */
        dst->setch((wchar_t)acc);
        
        /* 
         *   continue with the current character, since we've already skipped
         *   ahead to the next one 
         */
        return;

    case 'x':
        /* 
         *   Hex ASCII character number.  Read up to two hex digits as a
         *   character number.
         */
        for (i = 0, acc = 0, p->inc() ; i < 2 ; ++i, p->inc())
        {
            /* get the next character */
            cur = p->getch();
            
            /* 
             *   if it's another hex digit, add it into the accumulator;
             *   otherwise, we're done 
             */
            if (is_xdigit(cur))
                acc = 16*acc + value_of_xdigit(cur);
            else
                break;
        }
        
        /* use the accumulated value as the character number */
        dst->setch((wchar_t)acc);
        
        /* 
         *   continue with the current character, since we've already skipped
         *   ahead to the next one 
         */
        return;
        
    case '<':
    case '>':
    case '\\':
        /* just copy these literally */
        break;
        
    default:
        /* log a pedantic error */
        log_pedantic(TCERR_BACKSLASH_SEQ, cur);
        
        /* copy anything else as-is, including the backslash */
        dst->setch('\\');
        break;
    }

    /* set the output character */
    dst->setch(cur);

    /* skip the current character */
    p->inc();
}